

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void __thiscall google::anon_unknown_8::LogFileObject::~LogFileObject(LogFileObject *this)

{
  LogFileObject *this_local;
  
  ~LogFileObject(this);
  operator_delete(this,200);
  return;
}

Assistant:

LogFileObject::~LogFileObject() {
  std::lock_guard<std::mutex> l{mutex_};
  file_ = nullptr;
}